

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.hpp
# Opt level: O1

bool __thiscall grammar::has_any_empty_production(grammar *this)

{
  bool bVar1;
  pointer psVar2;
  vector<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
  local_38;
  
  nonterminals(&local_38,this);
  for (psVar2 = local_38.
                super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 != local_38.
                super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
    bVar1 = has_empty_production(this,(token_t)psVar2->internal_rep);
    if (bVar1) break;
  }
  if (local_38.
      super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return psVar2 != local_38.
                   super__Vector_base<strong_t<int,_grammar::token_tag>,_std::allocator<strong_t<int,_grammar::token_tag>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

[[nodiscard]] bool has_any_empty_production() const {
        for (const auto nonterm : this->nonterminals())
            if (this->has_empty_production(nonterm)) return true;

        return false;
    }